

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

char * nlohmann::json_abi_v3_11_3::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  byte *pbVar8;
  undefined8 uVar9;
  uint uVar10;
  
  if (-1 < min_exp) {
    pcVar7 = "min_exp < 0";
    uVar9 = 0x45e3;
LAB_001a4b6d:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,uVar9,"GGML_ASSERT(%s) failed",pcVar7);
  }
  if (max_exp < 1) {
    pcVar7 = "max_exp > 0";
    uVar9 = 0x45e4;
    goto LAB_001a4b6d;
  }
  uVar10 = decimal_exponent + len;
  if ((int)uVar10 <= max_exp && -1 < decimal_exponent) {
    memset(buf + len,0x30,(long)(int)uVar10 - (long)len);
    pcVar7 = buf + (int)uVar10;
    pcVar7[0] = '.';
    pcVar7[1] = '0';
    return pcVar7 + 2;
  }
  if (0 < (int)uVar10 && (int)uVar10 <= max_exp) {
    if (decimal_exponent < 0) {
      uVar5 = (ulong)uVar10;
      memmove(buf + uVar5 + 1,buf + uVar5,(uint)len - uVar5);
      buf[uVar5] = '.';
      return buf + (ulong)(uint)len + 1;
    }
    pcVar7 = "k > n";
    uVar9 = 0x45fe;
    goto LAB_001a4b6d;
  }
  if (min_exp < (int)uVar10 && (int)uVar10 < 1) {
    memmove(buf + (ulong)-uVar10 + 2,buf,(long)len);
    buf[0] = '0';
    buf[1] = '.';
    memset(buf + 2,0x30,(ulong)-uVar10);
    return buf + (ulong)-uVar10 + 2 + len;
  }
  if (len != 1) {
    memmove(buf + 2,buf + 1,(long)len - 1);
    buf[1] = '.';
    buf = buf + len;
  }
  buf[1] = 'e';
  if ((int)uVar10 < -0x3e6) {
    pcVar7 = "e > -1000";
    uVar9 = 0x45ae;
    goto LAB_001a4b6d;
  }
  if (1000 < (int)uVar10) {
    pcVar7 = "e < 1000";
    uVar9 = 0x45af;
    goto LAB_001a4b6d;
  }
  uVar1 = uVar10 - 1;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  buf[2] = ((int)uVar10 < 1) * '\x02' + '+';
  if (uVar3 < 10) {
    buf[3] = '0';
  }
  else {
    if (99 < uVar3) {
      uVar10 = (uVar3 & 0xffff) / 100;
      buf[3] = (char)uVar10 + '0';
      iVar4 = uVar3 + uVar10 * -100;
      bVar2 = (byte)((iVar4 * 0x67 & 0xffffU) >> 10);
      buf[4] = bVar2 | 0x30;
      pbVar8 = (byte *)(buf + 5);
      bVar2 = (char)iVar4 + bVar2 * -10;
      lVar6 = 4;
      goto LAB_001a4b21;
    }
    bVar2 = (byte)((uVar3 & 0xff) / 10);
    buf[3] = bVar2 | 0x30;
    uVar3 = (uint)(byte)((char)uVar3 + bVar2 * -10);
  }
  bVar2 = (byte)uVar3;
  pbVar8 = (byte *)(buf + 4);
  lVar6 = 3;
LAB_001a4b21:
  *pbVar8 = bVar2 | 0x30;
  return buf + lVar6 + 2;
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
                           int min_exp, int max_exp)
{
    JSON_ASSERT(min_exp < 0);
    JSON_ASSERT(max_exp > 0);

    const int k = len;
    const int n = len + decimal_exponent;

    // v = buf * 10^(n-k)
    // k is the length of the buffer (number of decimal digits)
    // n is the position of the decimal point relative to the start of the buffer.

    if (k <= n && n <= max_exp)
    {
        // digits[000]
        // len <= max_exp + 2

        std::memset(buf + k, '0', static_cast<size_t>(n) - static_cast<size_t>(k));
        // Make it look like a floating-point number (#362, #378)
        buf[n + 0] = '.';
        buf[n + 1] = '0';
        return buf + (static_cast<size_t>(n) + 2);
    }

    if (0 < n && n <= max_exp)
    {
        // dig.its
        // len <= max_digits10 + 1

        JSON_ASSERT(k > n);

        std::memmove(buf + (static_cast<size_t>(n) + 1), buf + n, static_cast<size_t>(k) - static_cast<size_t>(n));
        buf[n] = '.';
        return buf + (static_cast<size_t>(k) + 1U);
    }

    if (min_exp < n && n <= 0)
    {
        // 0.[000]digits
        // len <= 2 + (-min_exp - 1) + max_digits10

        std::memmove(buf + (2 + static_cast<size_t>(-n)), buf, static_cast<size_t>(k));
        buf[0] = '0';
        buf[1] = '.';
        std::memset(buf + 2, '0', static_cast<size_t>(-n));
        return buf + (2U + static_cast<size_t>(-n) + static_cast<size_t>(k));
    }

    if (k == 1)
    {
        // dE+123
        // len <= 1 + 5

        buf += 1;
    }
    else
    {
        // d.igitsE+123
        // len <= max_digits10 + 1 + 5

        std::memmove(buf + 2, buf + 1, static_cast<size_t>(k) - 1);
        buf[1] = '.';
        buf += 1 + static_cast<size_t>(k);
    }

    *buf++ = 'e';
    return append_exponent(buf, n - 1);
}